

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<kj::AsyncCapabilityStream::ReadResult> __thiscall
kj::anon_unknown_0::AsyncStreamFd::tryReadInternal
          (AsyncStreamFd *this,void *buffer,size_t minBytes,size_t maxBytes,OwnFd *fdBuffer,
          size_t maxFds,ReadResult alreadyRead)

{
  int iVar1;
  PromiseArena *pPVar2;
  ReadResult alreadyRead_00;
  undefined1 auVar3 [8];
  Exception *pEVar4;
  Exception *pEVar5;
  AncillaryMessage *pAVar6;
  RemoveConst<kj::AncillaryMessage> *pRVar7;
  AncillaryMessage *pAVar8;
  int iVar9;
  void *pvVar10;
  undefined4 extraout_var;
  PromiseBase PVar11;
  cmsghdr *pcVar12;
  OwnPromiseNode OVar13;
  OwnPromiseNode extraout_RAX;
  PromiseBase extraout_RAX_00;
  PromiseFulfiller<void> *pPVar14;
  ulong uVar15;
  TransformPromiseNodeBase *this_00;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  ArrayDisposer *in_stack_00000018;
  OwnFd ownFd;
  Fault f;
  Vector<kj::AncillaryMessage> ancillaryMessages;
  Array<void_*> cmsgSpace_heap;
  msghdr msg;
  void *cmsgSpace_stack [16];
  OwnFd local_1c4;
  cmsghdr *local_1c0;
  RemoveConst<kj::Exception::Detail> *local_1b8;
  Detail *local_1b0;
  undefined1 local_1a8 [8];
  Exception *pEStack_1a0;
  Exception *local_198;
  ArrayDisposer *local_190;
  AsyncStreamFd *local_180;
  Disposer *local_178;
  PromiseFulfiller<void> *local_170;
  Vector<kj::AncillaryMessage> local_168;
  void *local_148;
  OwnFd local_13c;
  cmsghdr *local_138;
  ulong uStack_130;
  undefined8 *local_128;
  msghdr local_118;
  void *local_d8;
  OwnFd *local_d0;
  iovec local_c8;
  undefined1 local_b8 [136];
  
  local_1b0 = (Detail *)maxFds;
  local_180 = this;
  local_178 = (Disposer *)buffer;
  if (alreadyRead.byteCount != 0 || (*(byte *)((long)buffer + 0x90) & 1) != 0) {
    local_118.msg_control = (void *)0x0;
    local_118.msg_controllen = 0;
    local_118.msg_name = (PromiseNode *)0x0;
    local_118.msg_namelen = 0;
    local_118._12_4_ = 0;
    local_118.msg_flags = 0;
    local_118._52_4_ = 0;
    local_118.msg_iov = &local_c8;
    local_118.msg_iovlen = 1;
    local_1b8 = (RemoveConst<kj::Exception::Detail> *)alreadyRead.byteCount;
    uVar15 = 0x810;
    if ((*(byte *)((long)buffer + 0x90) & 1) == 0) {
      uVar15 = (alreadyRead.byteCount * 4 + 7 & 0xfffffffffffffff8) + 0x10;
    }
    local_d8 = (void *)maxBytes;
    local_d0 = fdBuffer;
    local_c8.iov_base = (void *)minBytes;
    local_c8.iov_len = (size_t)fdBuffer;
    if (uVar15 < 0x88) {
      local_138 = (cmsghdr *)0x0;
      uStack_130 = 0;
      local_128 = (undefined8 *)0x0;
      pcVar12 = (cmsghdr *)local_b8;
    }
    else {
      uVar18 = uVar15 >> 3;
      pcVar12 = (cmsghdr *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (8,uVar18,uVar18,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_128 = &kj::_::HeapArrayDisposer::instance;
      local_138 = pcVar12;
      uStack_130 = uVar18;
    }
    local_1c0 = local_138;
    memset(pcVar12,0,uVar15);
    local_118.msg_control = pcVar12;
    local_118.msg_controllen = uVar15;
LAB_0043352c:
    pvVar10 = (void *)recvmsg(*(int *)((long)buffer + 0x10),&local_118,0x40000000);
    if ((long)pvVar10 < 0) goto code_r0x00433545;
    local_168.builder.ptr = (AncillaryMessage *)0x0;
    local_168.builder.pos = (AncillaryMessage *)0x0;
    local_168.builder.endPtr = (AncillaryMessage *)0x0;
    local_168.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
    if ((cmsghdr *)local_118.msg_control == (cmsghdr *)0x0 || local_118.msg_controllen < 0x10) {
      pPVar14 = (PromiseFulfiller<void> *)0x0;
      pcVar12 = local_1c0;
    }
    else {
      local_170 = (PromiseFulfiller<void> *)0x0;
      pcVar12 = (cmsghdr *)local_118.msg_control;
      uVar15 = local_118.msg_controllen;
      local_148 = (void *)minBytes;
      do {
        if (uVar15 < 0x10) {
          uVar15 = 0;
        }
        else {
          iVar9 = pcVar12->cmsg_level;
          if ((iVar9 == 1) && (pcVar12->cmsg_type == 1)) {
            uVar18 = pcVar12->cmsg_len;
            if (uVar15 <= pcVar12->cmsg_len) {
              uVar18 = uVar15;
            }
            local_1a8 = (undefined1  [8])0x0;
            pEStack_1a0 = (Exception *)0x0;
            local_198 = (Exception *)0x0;
            local_190 = (ArrayDisposer *)&NullArrayDisposer::instance;
            minBytes = (size_t)local_148;
            if (3 < uVar18 - 0x10) {
              uVar17 = 0;
              do {
                pPVar14 = local_170;
                local_1c4.fd = *(int *)((long)&pcVar12[1].cmsg_len + uVar17);
                if (local_170 < alreadyRead.byteCount) {
                  local_13c.fd = *(int *)((long)&local_1b0->id + (long)local_170 * 4);
                  *(int *)((long)&local_1b0->id + (long)local_170 * 4) = local_1c4.fd;
                  local_1c4.fd = -1;
                  OwnFd::~OwnFd(&local_13c);
                  local_170 = (PromiseFulfiller<void> *)
                              ((long)&(pPVar14->super_PromiseRejector)._vptr_PromiseRejector + 1);
                }
                else {
                  if (pEStack_1a0 == local_198) {
                    sVar16 = (long)pEStack_1a0 - (long)local_1a8 >> 1;
                    if ((undefined1  [8])pEStack_1a0 == local_1a8) {
                      sVar16 = 4;
                    }
                    Vector<kj::OwnFd>::setCapacity((Vector<kj::OwnFd> *)local_1a8,sVar16);
                  }
                  *(int *)&(pEStack_1a0->ownFile).content.ptr = local_1c4.fd;
                  local_1c4.fd = -1;
                  pEStack_1a0 = (Exception *)((long)&(pEStack_1a0->ownFile).content.ptr + 4);
                }
                OwnFd::~OwnFd(&local_1c4);
                pEVar5 = local_198;
                pEVar4 = pEStack_1a0;
                auVar3 = local_1a8;
                uVar17 = uVar17 + 4;
              } while ((uVar18 - 0x10 & 0xfffffffffffffffc) != uVar17);
              minBytes = (size_t)local_148;
              if (local_1a8 != (undefined1  [8])0x0) {
                local_1a8 = (undefined1  [8])0x0;
                pEStack_1a0 = (Exception *)0x0;
                local_198 = (Exception *)0x0;
                (**local_190->_vptr_ArrayDisposer)
                          (local_190,auVar3,4,(long)pEVar4 - (long)auVar3 >> 2,
                           (long)pEVar5 - (long)auVar3 >> 2,
                           ArrayDisposer::Dispose_<kj::OwnFd>::destruct);
                minBytes = (size_t)local_148;
              }
            }
          }
          else if (*(char *)&((Disposer *)((long)buffer + 0x90))->_vptr_Disposer == '\x01') {
            uVar18 = pcVar12->cmsg_len;
            if (uVar15 <= pcVar12->cmsg_len) {
              uVar18 = uVar15;
            }
            if (local_168.builder.pos == local_168.builder.endPtr) {
              sVar16 = ((long)local_168.builder.pos - (long)local_168.builder.ptr >> 3) *
                       0x5555555555555556;
              if (local_168.builder.pos == local_168.builder.ptr) {
                sVar16 = 4;
              }
              Vector<kj::AncillaryMessage>::setCapacity(&local_168,sVar16);
              iVar9 = pcVar12->cmsg_level;
            }
            iVar1 = pcVar12->cmsg_type;
            (local_168.builder.pos)->level = iVar9;
            (local_168.builder.pos)->type = iVar1;
            ((local_168.builder.pos)->data).ptr = (uchar *)(pcVar12 + 1);
            ((local_168.builder.pos)->data).size_ = uVar18 - 0x10;
            local_168.builder.pos = local_168.builder.pos + 1;
          }
          bVar19 = pcVar12->cmsg_len <= uVar15;
          uVar18 = uVar15 - pcVar12->cmsg_len;
          uVar15 = 0;
          if (bVar19) {
            uVar15 = uVar18;
          }
        }
        pcVar12 = __cmsg_nxthdr(&local_118,pcVar12);
        buffer = local_178;
      } while (pcVar12 != (cmsghdr *)0x0);
      if (((long)local_168.builder.pos - (long)local_168.builder.ptr != 0) &&
         (*(char *)&local_178[0x12]._vptr_Disposer == '\x01')) {
        (**(code **)*local_178[0x14]._vptr_Disposer)
                  (local_178[0x14]._vptr_Disposer,local_168.builder.ptr,
                   ((long)local_168.builder.pos - (long)local_168.builder.ptr >> 3) *
                   -0x5555555555555555);
      }
      pAVar8 = local_168.builder.endPtr;
      pRVar7 = local_168.builder.pos;
      pAVar6 = local_168.builder.ptr;
      in_stack_00000018 =
           (ArrayDisposer *)
           ((long)&(local_170->super_PromiseRejector)._vptr_PromiseRejector +
           (long)&in_stack_00000018->_vptr_ArrayDisposer);
      pPVar14 = local_170;
      pcVar12 = local_1c0;
      if (local_168.builder.ptr != (AncillaryMessage *)0x0) {
        local_168.builder.ptr = (AncillaryMessage *)0x0;
        local_168.builder.pos = (AncillaryMessage *)0x0;
        local_168.builder.endPtr = (AncillaryMessage *)0x0;
        (**(local_168.builder.disposer)->_vptr_ArrayDisposer)
                  (local_168.builder.disposer,pAVar6,0x18,
                   ((long)pRVar7 - (long)pAVar6 >> 3) * -0x5555555555555555,
                   ((long)pAVar8 - (long)pAVar6 >> 3) * -0x5555555555555555,0);
        pPVar14 = local_170;
        pcVar12 = local_138;
      }
    }
    local_1b8 = (RemoveConst<kj::Exception::Detail> *)((long)local_1b8 - (long)pPVar14);
    local_1b0 = (Detail *)((long)&local_1b0->id + (long)pPVar14 * 4);
    PVar11.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    goto LAB_004339a2;
  }
  local_1b8 = (RemoveConst<kj::Exception::Detail> *)0x0;
  do {
    pvVar10 = (void *)read(*(int *)((long)buffer + 0x10),(void *)minBytes,(size_t)fdBuffer);
    if (-1 < (long)pvVar10) goto LAB_004339fe;
    iVar9 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar9 == -1);
  if (iVar9 == 0) {
    local_1b8 = (RemoveConst<kj::Exception::Detail> *)0x0;
LAB_00433a78:
    UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_1a8);
    auVar3 = local_1a8;
    pPVar2 = (PromiseArena *)(((String *)local_1a8)->content).size_;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_1a8 - (long)pPVar2) < 0x60) {
      pvVar10 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3a0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_1a8,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:720:11)>
                 ::anon_class_64_7_61fcc940_for_func::operator());
      *(undefined ***)((long)pvVar10 + 0x3a0) = &PTR_destroy_00625068;
      *(Disposer **)((long)pvVar10 + 0x3c0) = local_178;
      *(size_t *)((long)pvVar10 + 0x3c8) = minBytes;
      *(size_t *)((long)pvVar10 + 0x3d0) = maxBytes;
      *(OwnFd **)((long)pvVar10 + 0x3d8) = fdBuffer;
      *(Detail **)((long)pvVar10 + 0x3e0) = local_1b0;
      *(RemoveConst<kj::Exception::Detail> **)((long)pvVar10 + 1000) = local_1b8;
      *(size_t *)((long)pvVar10 + 0x3f0) = alreadyRead.capCount;
      *(ArrayDisposer **)((long)pvVar10 + 0x3f8) = in_stack_00000018;
      *(void **)((long)pvVar10 + 0x3a8) = pvVar10;
    }
    else {
      (((String *)local_1a8)->content).size_ = 0;
      this_00 = (TransformPromiseNodeBase *)(((Exception *)((long)local_1a8 + -400))->trace + 0x19);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_1a8,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:720:11)>
                 ::anon_class_64_7_61fcc940_for_func::operator());
      ((Exception *)((long)auVar3 + -400))->trace[0x19] = &PTR_destroy_00625068;
      ((Exception *)((long)auVar3 + -400))->trace[0x1d] = local_178;
      ((Exception *)((long)auVar3 + -400))->trace[0x1e] = (void *)minBytes;
      ((Exception *)((long)auVar3 + -400))->trace[0x1f] = (void *)maxBytes;
      *(OwnFd **)&((Exception *)((long)auVar3 + -400))->traceCount = fdBuffer;
      (((Exception *)((long)auVar3 + -400))->details).builder.ptr = local_1b0;
      (((Exception *)((long)auVar3 + -400))->details).builder.pos = local_1b8;
      (((Exception *)((long)auVar3 + -400))->details).builder.endPtr =
           (Detail *)alreadyRead.capCount;
      (((Exception *)((long)auVar3 + -400))->details).builder.disposer = in_stack_00000018;
      ((Exception *)((long)auVar3 + -400))->trace[0x1a] = pPVar2;
    }
    local_b8._0_8_ = &DAT_0048a171;
    local_b8._8_8_ = &DAT_0048a1d0;
    local_b8._16_8_ = &DAT_4c0000058b;
    local_168.builder.ptr = (AncillaryMessage *)this_00;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_118,(OwnPromiseNode *)&local_168,(SourceLocation *)local_b8
              );
    pAVar6 = local_168.builder.ptr;
    (local_180->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)local_118.msg_name;
    PVar11.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_118.msg_name;
    if ((TransformPromiseNodeBase *)local_168.builder.ptr != (TransformPromiseNodeBase *)0x0) {
      local_168.builder.ptr = (AncillaryMessage *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pAVar6);
      PVar11.node.ptr = (OwnPromiseNode)(OwnPromiseNode)extraout_RAX.ptr;
    }
    auVar3 = local_1a8;
    if (local_1a8 == (undefined1  [8])0x0) {
      return (Promise<kj::AsyncCapabilityStream::ReadResult>)(PromiseNode *)PVar11.node.ptr;
    }
    local_1a8 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar3);
    return (Promise<kj::AsyncCapabilityStream::ReadResult>)(PromiseNode *)extraout_RAX_00.node.ptr;
  }
  local_118.msg_name = (PromiseNode *)0x0;
  local_b8._0_8_ = (char *)0x0;
  local_b8._8_8_ = (char *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_118,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
            );
  kj::_::Debug::Fault::~Fault((Fault *)&local_118);
LAB_00433a49:
  local_b8._0_8_ = alreadyRead.capCount;
  local_b8._8_8_ = in_stack_00000018;
LAB_00433a58:
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediatePromiseNode<kj::AsyncCapabilityStream::ReadResult>,kj::_::PromiseDisposer,kj::AsyncCapabilityStream::ReadResult>
            ((PromiseDisposer *)&local_118,(ReadResult *)local_b8);
  (local_180->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)local_118.msg_name;
  return (Promise<kj::AsyncCapabilityStream::ReadResult>)(PromiseNode *)local_118.msg_name;
code_r0x00433545:
  PVar11.node.ptr._0_4_ = kj::_::Debug::getOsErrorNumber(true);
  PVar11.node.ptr._4_4_ = extraout_var;
  if ((int)PVar11.node.ptr != -1) goto code_r0x00433554;
  goto LAB_0043352c;
code_r0x00433554:
  pcVar12 = local_1c0;
  if ((int)PVar11.node.ptr != 0) {
    local_1a8 = (undefined1  [8])0x0;
    local_168.builder.ptr = (AncillaryMessage *)0x0;
    local_168.builder.pos = (AncillaryMessage *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)local_1a8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
              );
    pcVar12 = local_1c0;
    kj::_::Debug::Fault::~Fault((Fault *)local_1a8);
    PVar11.node.ptr = (OwnPromiseNode)&DAT_00000005;
  }
LAB_004339a2:
  uVar15 = uStack_130;
  if (pcVar12 != (cmsghdr *)0x0) {
    local_138 = (cmsghdr *)0x0;
    uStack_130 = 0;
    (**(code **)*local_128)(local_128,pcVar12,8,uVar15,uVar15,0);
  }
  if ((int)PVar11.node.ptr == 0) {
    maxBytes = (size_t)local_d8;
    fdBuffer = local_d0;
    if ((long)pvVar10 < 0) goto LAB_00433a78;
LAB_004339fe:
    if (pvVar10 != (void *)0x0) {
      if (pvVar10 <= maxBytes && maxBytes - (long)pvVar10 != 0) {
        alreadyRead_00.capCount = alreadyRead.capCount + (long)pvVar10;
        alreadyRead_00.byteCount = (size_t)local_1b8;
        OVar13.ptr = (PromiseNode *)
                     tryReadInternal(local_180,local_178,minBytes + (long)pvVar10,
                                     maxBytes - (long)pvVar10,
                                     (OwnFd *)((long)fdBuffer - (long)pvVar10),(size_t)local_1b0,
                                     alreadyRead_00);
        return (Promise<kj::AsyncCapabilityStream::ReadResult>)(OwnPromiseNode)OVar13.ptr;
      }
      local_b8._0_8_ = (long)pvVar10 + alreadyRead.capCount;
      local_b8._8_8_ = in_stack_00000018;
      goto LAB_00433a58;
    }
  }
  else if ((int)PVar11.node.ptr != 5) {
    return (Promise<kj::AsyncCapabilityStream::ReadResult>)(PromiseNode *)PVar11.node.ptr;
  }
  goto LAB_00433a49;
}

Assistant:

Promise<ReadResult> tryReadInternal(void* buffer, size_t minBytes, size_t maxBytes,
                                      OwnFd* fdBuffer, size_t maxFds,
                                      ReadResult alreadyRead) {
    // `alreadyRead` is the number of bytes we have already received via previous reads -- minBytes,
    // maxBytes, and buffer have already been adjusted to account for them, but this count must
    // be included in the final return value.

    ssize_t n;
    if (maxFds == 0 && ancillaryMsgCallback == kj::none) {
      KJ_NONBLOCKING_SYSCALL(n = ::read(fd, buffer, maxBytes)) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }
    } else {
      struct msghdr msg;
      memset(&msg, 0, sizeof(msg));

      struct iovec iov;
      memset(&iov, 0, sizeof(iov));
      iov.iov_base = buffer;
      iov.iov_len = maxBytes;
      msg.msg_iov = &iov;
      msg.msg_iovlen = 1;

      // Allocate space to receive a cmsg.
      size_t msgBytes;
      if (ancillaryMsgCallback == kj::none) {
#if __APPLE__ || __FreeBSD__
        // Until very recently (late 2018 / early 2019), FreeBSD suffered from a bug in which when
        // an SCM_RIGHTS message was truncated on delivery, it would not close the FDs that weren't
        // delivered -- they would simply leak: https://bugs.freebsd.org/131876
        //
        // My testing indicates that MacOS has this same bug as of today (April 2019). I don't know
        // if they plan to fix it or are even aware of it.
        //
        // To handle both cases, we will always provide space to receive 512 FDs. Hopefully, this is
        // greater than the maximum number of FDs that these kernels will transmit in one message
        // PLUS enough space for any other ancillary messages that could be sent before the
        // SCM_RIGHTS message to push it back in the buffer. I couldn't find any firm documentation
        // on these limits, though -- I only know that Linux is limited to 253, and I saw a hint in
        // a comment in someone else's application that suggested FreeBSD is the same. Hopefully,
        // then, this is sufficient to prevent attacks. But if not, there's nothing more we can do;
        // it's really up to the kernel to fix this.
        msgBytes = CMSG_SPACE(sizeof(int) * 512);
#else
        msgBytes = CMSG_SPACE(sizeof(int) * maxFds);
#endif
      } else {
        // If we want room for ancillary messages instead of or in addition to FDs, just use the
        // same amount of cushion as in the MacOS/FreeBSD case above.
        // Someday we may want to allow customization here, but there's no immediate use for it.
        msgBytes = CMSG_SPACE(sizeof(int) * 512);
      }

      // On Linux, CMSG_SPACE will align to a word-size boundary, but on Mac it always aligns to a
      // 32-bit boundary. I guess aligning to 32 bits helps avoid the problem where you
      // surprisingly end up with space for two file descriptors when you only wanted one. However,
      // cmsghdr's preferred alignment is word-size (it contains a size_t). If we stack-allocate
      // the buffer, we need to make sure it is aligned properly (maybe not on x64, but maybe on
      // other platforms), so we want to allocate an array of words (we use void*). So... we use
      // CMSG_SPACE() and then additionally round up to deal with Mac.
      size_t msgWords = (msgBytes + sizeof(void*) - 1) / sizeof(void*);
      KJ_STACK_ARRAY(void*, cmsgSpace, msgWords, 16, 256);
      auto cmsgBytes = cmsgSpace.asBytes();
      memset(cmsgBytes.begin(), 0, cmsgBytes.size());
      msg.msg_control = cmsgBytes.begin();
      msg.msg_controllen = msgBytes;

#ifdef MSG_CMSG_CLOEXEC
      static constexpr int RECVMSG_FLAGS = MSG_CMSG_CLOEXEC;
#else
      static constexpr int RECVMSG_FLAGS = 0;
#endif

      KJ_NONBLOCKING_SYSCALL(n = ::recvmsg(fd, &msg, RECVMSG_FLAGS)) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }

      if (n >= 0) {
        // Process all messages.
        //
        // WARNING DANGER: We have to be VERY careful not to miss a file descriptor here, because
        // if we do, then that FD will never be closed, and a malicious peer could exploit this to
        // fill up our FD table, creating a DoS attack. Some things to keep in mind:
        // - CMSG_SPACE() could have rounded up the space for alignment purposes, and this could
        //   mean we permitted the kernel to deliver more file descriptors than `maxFds`. We need
        //   to close the extras.
        // - We can receive multiple ancillary messages at once. In particular, there is also
        //   SCM_CREDENTIALS. The sender decides what to send. They could send SCM_CREDENTIALS
        //   first followed by SCM_RIGHTS. We need to make sure we see both.
        size_t nfds = 0;
        size_t spaceLeft = msg.msg_controllen;
        Vector<AncillaryMessage> ancillaryMessages;
        for (struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg);
            cmsg != nullptr; cmsg = CMSG_NXTHDR(&msg, cmsg)) {
          if (spaceLeft >= CMSG_LEN(0) &&
              cmsg->cmsg_level == SOL_SOCKET && cmsg->cmsg_type == SCM_RIGHTS) {
            // Some operating systems (like MacOS) do not adjust csmg_len when the message is
            // truncated. We must do so ourselves or risk overrunning the buffer.
            auto len = kj::min(cmsg->cmsg_len, spaceLeft);
            auto data = arrayPtr(reinterpret_cast<int*>(CMSG_DATA(cmsg)),
                                 (len - CMSG_LEN(0)) / sizeof(int));
            kj::Vector<kj::OwnFd> trashFds;
            for (auto fd: data) {
              kj::OwnFd ownFd(fd);
              if (nfds < maxFds) {
                fdBuffer[nfds++] = kj::mv(ownFd);
              } else {
                trashFds.add(kj::mv(ownFd));
              }
            }
          } else if (spaceLeft >= CMSG_LEN(0) && ancillaryMsgCallback != kj::none) {
            auto len = kj::min(cmsg->cmsg_len, spaceLeft);
            auto data = ArrayPtr<const byte>(CMSG_DATA(cmsg), len - CMSG_LEN(0));
            ancillaryMessages.add(cmsg->cmsg_level, cmsg->cmsg_type, data);
          }

          if (spaceLeft >= CMSG_LEN(0) && spaceLeft >= cmsg->cmsg_len) {
            spaceLeft -= cmsg->cmsg_len;
          } else {
            spaceLeft = 0;
          }
        }

#ifndef MSG_CMSG_CLOEXEC
        for (size_t i = 0; i < nfds; i++) {
          setCloseOnExec(fdBuffer[i]);
        }
#endif

        if (ancillaryMessages.size() > 0) {
          KJ_IF_SOME(fn, ancillaryMsgCallback) {
            fn(ancillaryMessages.asPtr());
          }
        }

        alreadyRead.capCount += nfds;
        fdBuffer += nfds;
        maxFds -= nfds;
      }
    }

    if (false) {
    error:
      return alreadyRead;
    }

    if (n < 0) {
      // Read would block.
      return observer.whenBecomesReadable().then(
          [this, buffer, minBytes, maxBytes, fdBuffer, maxFds, alreadyRead]() {
              return tryReadInternal(buffer, minBytes, maxBytes, fdBuffer, maxFds, alreadyRead);
      });
    } else if (n == 0) {
      // EOF -OR- maxBytes == 0.
      return alreadyRead;
    } else if (implicitCast<size_t>(n) >= minBytes) {
      // We read enough to stop here.
      alreadyRead.byteCount += n;
      return alreadyRead;
    } else {
      // The kernel returned fewer bytes than we asked for (and fewer than we need).

      buffer = reinterpret_cast<byte*>(buffer) + n;
      minBytes -= n;
      maxBytes -= n;
      alreadyRead.byteCount += n;

      // According to David Klempner, who works on Stubby at Google, we sadly CANNOT assume that
      // we've consumed the whole read buffer here. If a signal is delivered in the middle of a
      // read() -- yes, even a non-blocking read -- it can cause the kernel to return a partial
      // result, with data still in the buffer.
      //     https://bugzilla.kernel.org/show_bug.cgi?id=199131
      //     https://twitter.com/CaptainSegfault/status/1112622245531144194
      //
      // Unfortunately, we have no choice but to issue more read()s until it either tells us EOF
      // or EAGAIN. We used to have an optimization here using observer.atEndHint() (when it is
      // non-null) to avoid a redundant call to read(). Alas...
      return tryReadInternal(buffer, minBytes, maxBytes, fdBuffer, maxFds, alreadyRead);
    }
  }